

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O1

OPJ_BOOL opj_jp2_write_ftyp(opj_jp2_t *jp2,opj_stream_private_t *cio,opj_event_mgr_t *p_manager)

{
  OPJ_BYTE *p_buffer;
  OPJ_SIZE_T OVar1;
  uint uVar2;
  ulong size;
  ulong uVar3;
  
  if (cio == (opj_stream_private_t *)0x0) {
    __assert_fail("cio != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                  ,0x6f1,
                  "OPJ_BOOL opj_jp2_write_ftyp(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (jp2 != (opj_jp2_t *)0x0) {
    if (p_manager != (opj_event_mgr_t *)0x0) {
      uVar2 = jp2->numcl * 4 + 0x10;
      size = (ulong)uVar2;
      p_buffer = (OPJ_BYTE *)opj_calloc(1,size);
      if (p_buffer == (OPJ_BYTE *)0x0) {
        uVar2 = 0;
        opj_event_msg(p_manager,1,"Not enough memory to handle ftyp data\n");
      }
      else {
        opj_write_bytes_LE(p_buffer,uVar2,4);
        opj_write_bytes_LE(p_buffer + 4,0x66747970,4);
        opj_write_bytes_LE(p_buffer + 8,jp2->brand,4);
        opj_write_bytes_LE(p_buffer + 0xc,jp2->minversion,4);
        if (jp2->numcl != 0) {
          uVar3 = 0;
          do {
            opj_write_bytes_LE(p_buffer + 0x10,jp2->cl[uVar3],4);
            uVar3 = uVar3 + 1;
          } while (uVar3 < jp2->numcl);
        }
        OVar1 = opj_stream_write_data(cio,p_buffer,size,p_manager);
        if (OVar1 != size) {
          opj_event_msg(p_manager,1,"Error while writing ftyp data to stream\n");
        }
        uVar2 = (uint)(OVar1 == size);
        opj_free(p_buffer);
      }
      return uVar2;
    }
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                  ,0x6f3,
                  "OPJ_BOOL opj_jp2_write_ftyp(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  __assert_fail("jp2 != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                ,0x6f2,
                "OPJ_BOOL opj_jp2_write_ftyp(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
               );
}

Assistant:

static OPJ_BOOL opj_jp2_write_ftyp(opj_jp2_t *jp2,
                                   opj_stream_private_t *cio,
                                   opj_event_mgr_t * p_manager)
{
    OPJ_UINT32 i;
    OPJ_UINT32 l_ftyp_size;
    OPJ_BYTE * l_ftyp_data, * l_current_data_ptr;
    OPJ_BOOL l_result;

    /* preconditions */
    assert(cio != 00);
    assert(jp2 != 00);
    assert(p_manager != 00);
    l_ftyp_size = 16 + 4 * jp2->numcl;

    l_ftyp_data = (OPJ_BYTE *) opj_calloc(1, l_ftyp_size);

    if (l_ftyp_data == 00) {
        opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to handle ftyp data\n");
        return OPJ_FALSE;
    }

    l_current_data_ptr = l_ftyp_data;

    opj_write_bytes(l_current_data_ptr, l_ftyp_size, 4); /* box size */
    l_current_data_ptr += 4;

    opj_write_bytes(l_current_data_ptr, JP2_FTYP, 4); /* FTYP */
    l_current_data_ptr += 4;

    opj_write_bytes(l_current_data_ptr, jp2->brand, 4); /* BR */
    l_current_data_ptr += 4;

    opj_write_bytes(l_current_data_ptr, jp2->minversion, 4); /* MinV */
    l_current_data_ptr += 4;

    for (i = 0; i < jp2->numcl; i++)  {
        opj_write_bytes(l_current_data_ptr, jp2->cl[i], 4); /* CL */
    }

    l_result = (opj_stream_write_data(cio, l_ftyp_data, l_ftyp_size,
                                      p_manager) == l_ftyp_size);
    if (! l_result) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Error while writing ftyp data to stream\n");
    }

    opj_free(l_ftyp_data);

    return l_result;
}